

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateFunctionContextAccess
               (ExpressionTranslateContext *ctx,ExprFunctionContextAccess *expression)

{
  TypeRef *pTVar1;
  TypeClass *pTVar2;
  TypeClass *classType;
  TypeRef *refType;
  ExprFunctionContextAccess *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  pTVar1 = getType<TypeRef>(expression->function->contextType);
  if (pTVar1 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x50d,
                  "void TranslateFunctionContextAccess(ExpressionTranslateContext &, ExprFunctionContextAccess *)"
                 );
  }
  pTVar2 = getType<TypeClass>(pTVar1->subType);
  if (pTVar2 != (TypeClass *)0x0) {
    if ((pTVar2->super_TypeStruct).super_TypeBase.size == 0) {
      Print(ctx,"(");
      TranslateTypeName(ctx,(expression->super_ExprBase).type);
      Print(ctx,")0");
    }
    else {
      TranslateVariableName(ctx,expression->contextVariable);
    }
    return;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0x511,
                "void TranslateFunctionContextAccess(ExpressionTranslateContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

void TranslateFunctionContextAccess(ExpressionTranslateContext &ctx, ExprFunctionContextAccess *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->size == 0)
	{
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")0");
	}
	else
	{
		TranslateVariableName(ctx, expression->contextVariable);
	}
}